

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator::
ImmutableMessageFieldLiteGenerator
          (ImmutableMessageFieldLiteGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          Context *context)

{
  _Rb_tree_header *p_Var1;
  ClassNameResolver *pCVar2;
  FieldGeneratorInfo *pFVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_R9;
  
  (this->super_ImmutableFieldLiteGenerator)._vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableMessageOneofFieldLiteGenerator_0046fb00;
  this->descriptor_ = descriptor;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->messageBitIndex_ = messageBitIndex;
  pCVar2 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar2;
  pFVar3 = Context::GetFieldGeneratorInfo(context,descriptor);
  anon_unknown_5::SetMessageVariables
            (descriptor,messageBitIndex,(int)pFVar3,(FieldGeneratorInfo *)this->name_resolver_,
             (ClassNameResolver *)&this->variables_,in_R9);
  return;
}

Assistant:

ImmutableMessageFieldLiteGenerator::ImmutableMessageFieldLiteGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, Context* context)
    : descriptor_(descriptor),
      messageBitIndex_(messageBitIndex),
      name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, 0,
                      context->GetFieldGeneratorInfo(descriptor),
                      name_resolver_, &variables_);
}